

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O1

void __thiscall StunMsgCxx_ErrorResponse_Test::TestBody(StunMsgCxx_ErrorResponse_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  stun_attr_errcode *attr;
  stun_attr_unknown *attr_00;
  stun_attr_hdr *psVar3;
  unsigned_short *expected;
  char *message_00;
  pointer pcVar4;
  char *in_R9;
  size_t i;
  size_t n;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  error_code errcode;
  uint16_t unknown [3];
  message message;
  char reason_phrase [18];
  uint8_t tsx_id [12];
  AssertHelper local_d8;
  AssertHelper local_d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_c0;
  unknown local_a0;
  AssertHelper local_88;
  unsigned_short local_80 [3];
  undefined1 local_7a [10];
  base_message<std::allocator<unsigned_char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_38;
  
  local_58._M_dataplus._M_p = (pointer)0x206e776f6e6b6e55;
  local_58._M_string_length._0_1_ = 'A';
  local_58._M_string_length._1_1_ = 't';
  local_58._M_string_length._2_1_ = 't';
  local_58._M_string_length._3_1_ = 'r';
  local_58._M_string_length._4_1_ = 'i';
  local_58._M_string_length._5_1_ = 'b';
  local_58._M_string_length._6_1_ = 'u';
  local_58._M_string_length._7_1_ = 't';
  local_58.field_2._M_allocated_capacity._0_2_ = 0x65;
  local_58.field_2._8_8_ = 0xc072adc63334ad78;
  local_38 = 0x2e41da29;
  local_80[2] = 0x802c;
  local_80[0] = 0x1a;
  local_80[1] = 0x1b;
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)(local_7a + 10),0x111,
             (uint8_t *)(local_58.field_2._M_local_buf + 8));
  local_c0._M_dataplus._M_p._0_4_ = 0x1a4;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_string_length = (size_type)&local_58;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::errcode>
            ((base_message<std::allocator<unsigned_char>_> *)(local_7a + 10),(errcode *)&local_c0);
  local_a0.end_ = (uint16_t *)local_7a;
  expected = local_80;
  local_a0.pad_ = '\0';
  local_a0.begin_ = expected;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::unknown>
            ((base_message<std::allocator<unsigned_char>_> *)(local_7a + 10),&local_a0);
  local_a0.begin_ = (uint16_t *)&DAT_0000003c;
  local_d0.data_ =
       (AssertHelperData *)
       stun_msg_len((stun_msg_hdr *)
                    local_70.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_c0,"sizeof(expected_result)","message.size()",
             (unsigned_long *)&local_a0,(unsigned_long *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_c0._M_string_length ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((stun_msg_hdr *)local_a0.begin_ != (stun_msg_hdr *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((stun_msg_hdr *)local_a0.begin_ != (stun_msg_hdr *)0x0)) {
        (**(code **)(*(long *)local_a0.begin_ + 8))();
      }
      local_a0.begin_ = (uint16_t *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_c0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_c0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    anon_unknown.dwarf_24059::IsEqual
              ((anon_unknown_dwarf_24059 *)&local_a0,&DAT_0014b4e0,
               local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x3c);
    if ((char)local_a0.begin_ == '\0') {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c0,(internal *)&local_a0,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1df,local_c0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if (local_d0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
        local_d0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0.end_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_a0.begin_ = (uint16_t *)CONCAT44(local_a0.begin_._4_4_,0x111);
    uVar2 = stun_msg_type((stun_msg_hdr *)
                          local_70.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_d0.data_._0_2_ = uVar2;
    testing::internal::
    CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((internal *)&local_c0,"stun::message::binding_error_response","message.type()",
               (type *)&local_a0,(unsigned_short *)&local_d0);
    if ((char)local_c0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_c0._M_string_length ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_a0.begin_ != (uint16_t *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.begin_ != (uint16_t *)0x0)) {
          (**(code **)(*(long *)local_a0.begin_ + 8))();
        }
        local_a0.begin_ = (uint16_t *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_c0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_7a._2_8_ =
         local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    attr = (stun_attr_errcode *)
           stun_msg_next_attr((stun_msg_hdr *)
                              local_70.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
    local_a0.begin_ = (uint16_t *)CONCAT71(local_a0.begin_._1_7_,attr != (stun_attr_errcode *)0x0);
    local_a0.end_ = (uint16_t *)0x0;
    if (attr == (stun_attr_errcode *)0x0) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c0,(internal *)&local_a0,(AssertionResult *)"message.end() != i","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e6,local_c0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if (local_d0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
        local_d0.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0.end_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0.end_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a0.begin_ = (uint16_t *)CONCAT44(local_a0.begin_._4_4_,9);
      uVar2 = stun_attr_type((stun_attr_hdr *)attr);
      local_d0.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)&local_c0,"type::error_code","i->type()",(attribute_type *)&local_a0,
                 (unsigned_short *)&local_d0);
      if ((char)local_c0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c0._M_string_length ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1e7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_a0.begin_ != (uint16_t *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.begin_ != (uint16_t *)0x0)) {
            (**(code **)(*(long *)local_a0.begin_ + 8))();
          }
          local_a0.begin_ = (uint16_t *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_c0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a0.begin_ = (uint16_t *)local_7a._2_8_;
      local_d0.data_._0_4_ = 0x1a4;
      local_a0.end_ = (uint16_t *)attr;
      local_d8.data_._0_4_ = stun_attr_errcode_status(attr);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_c0,"420","errcode.status_code()",(int *)&local_d0,
                 (int *)&local_d8);
      if ((char)local_c0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c0._M_string_length ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ea,pcVar4);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          local_d0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_c0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stun::attribute::decoding_bits::errcode::reason_phrase_abi_cxx11_
                (&local_c0,(errcode *)&local_a0);
      testing::internal::CmpHelperEQ<char[18],std::__cxx11::string>
                ((internal *)&local_d0,"reason_phrase","errcode.reason_phrase()",
                 (char (*) [18])&local_58,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if (local_d0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_c8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message_00 = "";
        }
        else {
          message_00 = ((local_c8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1eb,message_00);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_c0._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
          }
          local_c0._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      attr_00 = (stun_attr_unknown *)
                stun_msg_next_attr((stun_msg_hdr *)local_7a._2_8_,(stun_attr_hdr *)attr);
      local_d0.data_._0_1_ = (internal)(attr_00 != (stun_attr_unknown *)0x0);
      local_c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (attr_00 == (stun_attr_unknown *)0x0) {
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_c0,(internal *)&local_d0,(AssertionResult *)"message.end() != ++i","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ed,local_c0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                   local_c0.field_2._M_local_buf[0]) + 1);
        }
        if (local_d8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_d8.data_ + 8))();
          }
          local_d8.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_d0.data_._0_4_ = 10;
        uVar2 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_d8.data_._0_2_ = uVar2;
        testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                  ((internal *)&local_c0,"type::unknown_attributes","i->type()",
                   (attribute_type *)&local_d0,(unsigned_short *)&local_d8);
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_c0._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1ee,pcVar4);
          testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_d0.data_ = (AssertHelperData *)0x3;
        local_d8.data_ = (AssertHelperData *)stun_attr_unknown_count(attr_00);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&local_c0,"(sizeof(unknown)/sizeof(unknown[0]))","unk.size()",
                   (unsigned_long *)&local_d0,(unsigned_long *)&local_d8);
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_c0._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1f1,pcVar4);
          testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            local_d0.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          n = 0;
          do {
            uVar2 = stun_attr_unknown_get(attr_00,n);
            local_d0.data_._0_2_ = uVar2;
            testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                      ((internal *)&local_c0,"unknown[i]","unk[i]",expected,
                       (unsigned_short *)&local_d0);
            if ((char)local_c0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_d0);
              pcVar4 = "";
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_c0._M_string_length !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = ((_Alloc_hider *)local_c0._M_string_length)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,499,pcVar4);
              testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
              testing::internal::AssertHelper::~AssertHelper(&local_d8);
              if (local_d0.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_d0.data_ + 8))();
                }
                local_d0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_c0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            n = n + 1;
            expected = expected + 1;
          } while (n != 3);
          psVar3 = stun_msg_next_attr((stun_msg_hdr *)local_7a._2_8_,(stun_attr_hdr *)attr_00);
          local_d0.data_._0_1_ = (internal)(psVar3 == (stun_attr_hdr *)0x0);
          local_c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (psVar3 != (stun_attr_hdr *)0x0) {
            testing::Message::Message((Message *)&local_d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,(internal *)&local_d0,(AssertionResult *)"message.end() == ++i",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1f6,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d8);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,
                              CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                       local_c0.field_2._M_local_buf[0]) + 1);
            }
            if (local_d8.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_d8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_d8.data_ + 8))();
              }
              local_d8.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  if ((stun_msg_hdr *)
      local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_70.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgCxx, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  stun::message message(stun::message::binding_error_response, tsx_id);
  message << stun::attribute::error_code(420, reason_phrase)
          << stun::attribute::unknown_attributes(unknown, ARRAY_SIZE(unknown));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_error_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::error_code, i->type());
  stun::attribute::decoding::error_code errcode =
    i->to<type::error_code>();
  EXPECT_EQ(420, errcode.status_code());
  EXPECT_EQ(reason_phrase, errcode.reason_phrase());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::unknown_attributes, i->type());
  stun::attribute::decoding::unknown_attributes unk =
    i->to<type::unknown_attributes>();
  ASSERT_EQ(ARRAY_SIZE(unknown), unk.size());
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], unk[i]);
  }

  ASSERT_TRUE(message.end() == ++i);
}